

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O1

void Llb_NonlinExperiment(Aig_Man_t *pAig,int Num)

{
  int iVar1;
  Aig_Man_t *p;
  Llb_Mnn_t *p_00;
  long lVar2;
  long lVar3;
  timespec ts_1;
  Gia_ParLlb_t Pars;
  timespec local_a0;
  Gia_ParLlb_t local_90;
  
  iVar1 = clock_gettime(3,(timespec *)&local_90);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_90._8_8_),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_90._0_8_ * -1000000;
  }
  Llb_ManSetDefaultParams(&local_90);
  local_90.fVerbose = 1;
  p = Aig_ManDupFlopsOnly(pAig);
  Aig_ManPrintStats(pAig);
  Aig_ManPrintStats(p);
  p_00 = Llb_MnnStart(pAig,p,&local_90);
  Llb_NonlinReachability(p_00);
  iVar1 = clock_gettime(3,&local_a0);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
  }
  p_00->timeTotal = lVar3 + lVar2;
  Llb_MnnStop(p_00);
  Aig_ManStop(p);
  return;
}

Assistant:

void Llb_NonlinExperiment( Aig_Man_t * pAig, int Num )
{
    Llb_Mnn_t * pMnn;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Aig_Man_t * p;
    abctime clk = Abc_Clock();

    Llb_ManSetDefaultParams( pPars );
    pPars->fVerbose = 1;

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    Aig_ManPrintStats( pAig );
    Aig_ManPrintStats( p );

    pMnn = Llb_MnnStart( pAig, p, pPars );
    Llb_NonlinReachability( pMnn );
    pMnn->timeTotal = Abc_Clock() - clk;
    Llb_MnnStop( pMnn );

    Aig_ManStop( p );
}